

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Path * __thiscall kj::Path::append(Path *__return_storage_ptr__,Path *this,PathPtr suffix)

{
  size_t sVar1;
  size_t sVar2;
  String *params;
  Array<kj::String> local_c8;
  String local_b0;
  String *local_98;
  String *p_1;
  String *__end1_1;
  String *__begin1_1;
  ArrayPtr<const_kj::String> *__range1_1;
  String *p;
  String *__end1;
  ArrayPtr<const_kj::String> *local_58;
  String *__begin1;
  Array<kj::String> *__range1;
  ArrayBuilder<kj::String> newParts;
  Path *this_local;
  PathPtr suffix_local;
  
  suffix_local.parts.ptr = (String *)suffix.parts.size_;
  this_local = (Path *)suffix.parts.ptr;
  newParts.disposer = (ArrayDisposer *)this;
  suffix_local.parts.size_ = (size_t)__return_storage_ptr__;
  sVar1 = Array<kj::String>::size(&this->parts);
  sVar2 = ArrayPtr<const_kj::String>::size((ArrayPtr<const_kj::String> *)&this_local);
  heapArrayBuilder<kj::String>((ArrayBuilder<kj::String> *)&__range1,sVar1 + sVar2);
  __begin1 = (String *)this;
  local_58 = (ArrayPtr<const_kj::String> *)Array<kj::String>::begin(&this->parts);
  p = Array<kj::String>::end((Array<kj::String> *)__begin1);
  for (; local_58 != (ArrayPtr<const_kj::String> *)p;
      local_58 = (ArrayPtr<const_kj::String> *)&local_58[1].size_) {
    __range1_1 = local_58;
    params = mv<kj::String>((String *)local_58);
    ArrayBuilder<kj::String>::add<kj::String>((ArrayBuilder<kj::String> *)&__range1,params);
  }
  __begin1_1 = (String *)&this_local;
  __end1_1 = ArrayPtr<const_kj::String>::begin((ArrayPtr<const_kj::String> *)__begin1_1);
  p_1 = ArrayPtr<const_kj::String>::end((ArrayPtr<const_kj::String> *)__begin1_1);
  for (; __end1_1 != p_1; __end1_1 = __end1_1 + 1) {
    local_98 = __end1_1;
    heapString(&local_b0,__end1_1);
    ArrayBuilder<kj::String>::add<kj::String>((ArrayBuilder<kj::String> *)&__range1,&local_b0);
    String::~String(&local_b0);
  }
  ArrayBuilder<kj::String>::finish(&local_c8,(ArrayBuilder<kj::String> *)&__range1);
  Path(__return_storage_ptr__,&local_c8,ALREADY_CHECKED);
  Array<kj::String>::~Array(&local_c8);
  ArrayBuilder<kj::String>::~ArrayBuilder((ArrayBuilder<kj::String> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

Path Path::append(PathPtr suffix) && {
  auto newParts = kj::heapArrayBuilder<String>(parts.size() + suffix.parts.size());
  for (auto& p: parts) newParts.add(kj::mv(p));
  for (auto& p: suffix.parts) newParts.add(heapString(p));
  return Path(newParts.finish(), ALREADY_CHECKED);
}